

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O3

Pattern * __thiscall CombinePattern::simplifyClone(CombinePattern *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  InstructionPattern *this_00;
  Pattern *pPVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  _func_int **pp_Var4;
  
  iVar1 = (*(this->context->super_DisjointPattern).super_Pattern._vptr_Pattern[10])();
  pp_Var4 = (this->instr->super_DisjointPattern).super_Pattern._vptr_Pattern;
  if ((char)iVar1 == '\0') {
    iVar1 = (*pp_Var4[10])();
    pp_Var4 = (this->context->super_DisjointPattern).super_Pattern._vptr_Pattern;
    if ((char)iVar1 == '\0') {
      iVar1 = (*pp_Var4[0xb])();
      if (((char)iVar1 == '\0') &&
         (iVar1 = (*(this->instr->super_DisjointPattern).super_Pattern._vptr_Pattern[0xb])(),
         (char)iVar1 == '\0')) {
        pPVar3 = (Pattern *)operator_new(0x18);
        iVar1 = (*(this->context->super_DisjointPattern).super_Pattern._vptr_Pattern[2])();
        iVar2 = (*(this->instr->super_DisjointPattern).super_Pattern._vptr_Pattern[2])();
        pPVar3->_vptr_Pattern = (_func_int **)&PTR__CombinePattern_003ce1d8;
        pPVar3[1]._vptr_Pattern = (_func_int **)CONCAT44(extraout_var_00,iVar1);
        pPVar3[2]._vptr_Pattern = (_func_int **)CONCAT44(extraout_var_01,iVar2);
        return pPVar3;
      }
      this_00 = (InstructionPattern *)operator_new(0x10);
      InstructionPattern::InstructionPattern(this_00,false);
      return (Pattern *)this_00;
    }
  }
  iVar1 = (*pp_Var4[2])();
  return (Pattern *)CONCAT44(extraout_var,iVar1);
}

Assistant:

Pattern *CombinePattern::simplifyClone(void) const

{				// We should only have to think at "our" level
  if (context->alwaysTrue())
    return instr->simplifyClone();
  if (instr->alwaysTrue())
    return context->simplifyClone();
  if (context->alwaysFalse()||instr->alwaysFalse())
    return new InstructionPattern(false);
  return new CombinePattern((ContextPattern *)context->simplifyClone(),
			    (InstructionPattern *)instr->simplifyClone());
}